

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg_tracing_helpers.hpp
# Opt level: O0

void so_5::impl::msg_tracing_helpers::details::
     make_trace_to<so_5::abstract_message_chain_t_const&,so_5::impl::msg_tracing_helpers::details::composed_action_name,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::impl::msg_tracing_helpers::details::chain_size>
               (ostream *s,abstract_message_chain_t *a,composed_action_name *other,
               type_index *other_1,intrusive_ptr_t<so_5::message_t> *other_2,chain_size *other_3)

{
  chain_size *other_local_3;
  intrusive_ptr_t<so_5::message_t> *other_local_2;
  type_index *other_local_1;
  composed_action_name *other_local;
  abstract_message_chain_t *a_local;
  ostream *s_local;
  
  make_trace_to_1(s,a);
  make_trace_to<so_5::impl::msg_tracing_helpers::details::composed_action_name,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::impl::msg_tracing_helpers::details::chain_size>
            (s,other,other_1,other_2,other_3);
  return;
}

Assistant:

void
make_trace_to( std::ostream & s, A && a, OTHER &&... other )
	{
		make_trace_to_1( s, std::forward< A >(a) );
		make_trace_to( s, std::forward< OTHER >(other)... );
	}